

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O1

ConeArgs * __thiscall
mp::
Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::CheckSqrtXnXmNonneg
          (ConeArgs *__return_storage_ptr__,
          Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,int res_var)

{
  double dVar1;
  int var;
  ptr ppVar2;
  pointer pdVar3;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  *pCVar4;
  QuadraticFunctionalConstraint *pQVar5;
  pair<int,_int> local_38;
  undefined8 local_30;
  
  __return_storage_ptr__->is_from_abs_ = false;
  (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->const_term = 0.0;
  __return_storage_ptr__->coef_extra = 0.0;
  (__return_storage_ptr__->res_vars_to_delete_).super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->res_vars_to_delete_).super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->res_vars_to_delete_).super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar4 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
           ::
           GetInitExpressionOfType<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>
                     ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                       *)(this->
                         super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                         ).mc_,res_var);
  if (((pCVar4 != (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
                   *)0x0) &&
      (dVar1 = (pCVar4->
               super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
               ).params_._M_elems[0], dVar1 == 0.5)) && (!NAN(dVar1))) {
    var = (pCVar4->
          super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
          ).args_._M_elems[0];
    pQVar5 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::GetInitExpressionOfType<mp::QuadraticFunctionalConstraint>
                       (&((this->
                          super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                          ).mc_)->
                         super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        ,var);
    if (pQVar5 == (QuadraticFunctionalConstraint *)0x0) {
      if (0.0 <= (((this->
                   super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                   ).mc_)->
                 super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 ).super_FlatModel<mp::DefaultFlatModelParams>.var_lb_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[var]) {
        local_38.first = 0;
        local_38.second = 0x3ff00000;
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  ((vector<double,std::allocator<double>> *)&__return_storage_ptr__->coefs_,
                   &local_38);
        local_38.first = var;
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                  ((vector<int,std::allocator<int>> *)&__return_storage_ptr__->vars_,&local_38);
        __return_storage_ptr__->coef_extra = 1.0;
        local_38.first = res_var;
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                  ((vector<int,std::allocator<int>> *)&__return_storage_ptr__->res_vars_to_delete_,
                   &local_38);
      }
    }
    else {
      dVar1 = (pQVar5->quad_expr_).constant_term_;
      if (((((dVar1 == 0.0) && (!NAN(dVar1))) &&
           ((*(size_ty *)
              ((long)&(pQVar5->quad_expr_).super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long> + 0x10) == 0 &&
            ((*(size_ty *)
               ((long)&(pQVar5->quad_expr_).super_QuadAndLinTerms.super_QuadTerms.folded_.
                       super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                       .m_data.
                       super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
               + 0x10) == 1 &&
             (ppVar2 = (pQVar5->quad_expr_).super_QuadAndLinTerms.super_QuadTerms.folded_.
                       super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                       .m_data.
                       super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                       .m_data_ptr, 0.0 <= ppVar2->second)))))) &&
          (pdVar3 = (((this->
                      super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                      ).mc_)->
                    super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    ).super_FlatModel<mp::DefaultFlatModelParams>.var_lb_.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start, 0.0 <= pdVar3[(ppVar2->first).first])) &&
         (0.0 <= pdVar3[(ppVar2->first).second])) {
        local_38 = (pair<int,_int>)ppVar2->second;
        local_30 = 0x3ff0000000000000;
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  ((vector<double,std::allocator<double>> *)&__return_storage_ptr__->coefs_,
                   &local_38);
        local_38 = ((pQVar5->quad_expr_).super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                   .m_data_ptr)->first;
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                  ((vector<int,std::allocator<int>> *)&__return_storage_ptr__->vars_,&local_38);
        local_38.second = var;
        local_38.first = res_var;
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                  ((vector<int,std::allocator<int>> *)&__return_storage_ptr__->res_vars_to_delete_,
                   &local_38);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ConeArgs CheckSqrtXnXmNonneg(int res_var) {
    ConeArgs result;
    if (const auto& pConPow = MC().template
        GetInitExpressionOfType<PowConstExpConstraint>(res_var)) {
      if (0.5 == pConPow->GetParameters()[0]) {     // sqrt(arg_pow)
        const auto arg_pow = pConPow->GetArguments()[0];
        if (auto pConQfc = MC().template
            GetInitExpressionOfType<           // arg_pow := QuadExpr
            QuadraticFunctionalConstraint>(arg_pow)) {
          const auto& qe = pConQfc->GetArguments();
          if (0.0 == std::fabs(qe.constant_term()) &&
              qe.GetBody().GetLinTerms().empty() &&
              1 == qe.GetBody().GetQPTerms().size()) {
            const auto& qpterms = qe.GetBody().GetQPTerms();
            if (qpterms.coef(0) >= 0.0 &&  // don't check if diff vars
                MC().lb(qpterms.var1(0)) >= 0.0 &&
                MC().lb(qpterms.var2(0)) >= 0.0) {
              result.coefs_ = {qpterms.coef(0), 1.0};
              result.vars_ = {qpterms.var1(0), qpterms.var2(0)};
              result.res_vars_to_delete_ = {res_var, arg_pow};
              return result;
            }
          }
        } else {        // It's just some variable
          if (MC().lb(arg_pow) >= 0.0) {
            result.coefs_ = {1.0};
            result.vars_ = {arg_pow};
            result.coef_extra = 1.0;   // for a new fixed var
            result.res_vars_to_delete_ = {res_var};
            return result;
          }
        }
      }
    }
    return result;
  }